

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl-int-reader.hpp
# Opt level: O2

int64_t yactfr::internal::anon_unknown_0::readFlSIntLe52At2(uint8_t *buf)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar2 = ((ulong)buf[2] |
          (ulong)buf[3] << 8 |
          (ulong)buf[4] << 0x10 | ((ulong)*(ushort *)(buf + 5) & 0x3fff) << 0x18) << 0xe;
  uVar3 = ((uint)(*buf >> 2) | (uint)buf[1] << 6) | uVar2;
  uVar1 = uVar3 | 0xfff0000000000000;
  if (uVar2 >> 0x33 == 0) {
    uVar1 = uVar3;
  }
  return uVar1;
}

Assistant:

std::int64_t readFlSIntLe52At2(const std::uint8_t * const buf) {
    std::uint64_t res = 0;

    res |= buf[6];
    res <<= 8;
    res |= buf[5];
    res <<= 8;
    res |= buf[4];
    res <<= 8;
    res |= buf[3];
    res <<= 8;
    res |= buf[2];
    res <<= 8;
    res |= buf[1];
    res <<= 6;
    res |= (buf[0] >> 2);
    res &= UINT64_C(0xfffffffffffff);

    if (res >> 51) {
        res |= UINT64_C(0xfff0000000000000);
    }

    return static_cast<std::int64_t>(res);
}